

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O3

string * __thiscall
absl::strings_internal::
JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
          (string *__return_storage_ptr__,strings_internal *this,strings_internal *start,size_t end,
          void *param_5)

{
  strings_internal *psVar1;
  pointer pcVar2;
  long lVar3;
  strings_internal *psVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != start) {
    lVar3 = *(long *)(this + 8);
    psVar4 = this + 0x20;
    for (psVar1 = psVar4; psVar1 != start; psVar1 = psVar1 + 0x20) {
      lVar3 = lVar3 + end + *(long *)(psVar1 + 8);
    }
    if (lVar3 != 0) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      memcpy(pcVar2,*(void **)this,*(size_t *)(this + 8));
      if (psVar4 != start) {
        pcVar2 = pcVar2 + *(long *)(this + 8);
        do {
          memcpy(pcVar2,param_5,end);
          memcpy(pcVar2 + end,*(void **)psVar4,*(size_t *)(psVar4 + 8));
          pcVar2 = pcVar2 + end + *(long *)(psVar4 + 8);
          psVar4 = psVar4 + 0x20;
        } while (psVar4 != start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          NoFormatter) {
  std::string result;
  if (start != end) {
    // Sums size
    auto&& start_value = *start;
    // Use uint64_t to prevent size_t overflow. We assume it is not possible for
    // in memory strings to overflow a uint64_t.
    uint64_t result_size = start_value.size();
    for (Iterator it = start; ++it != end;) {
      result_size += s.size();
      result_size += (*it).size();
    }

    if (result_size > 0) {
      constexpr uint64_t kMaxSize =
          uint64_t{(std::numeric_limits<size_t>::max)()};
      ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
      STLStringResizeUninitialized(&result, static_cast<size_t>(result_size));

      // Joins strings
      char* result_buf = &*result.begin();

      memcpy(result_buf, start_value.data(), start_value.size());
      result_buf += start_value.size();
      for (Iterator it = start; ++it != end;) {
        memcpy(result_buf, s.data(), s.size());
        result_buf += s.size();
        auto&& value = *it;
        memcpy(result_buf, value.data(), value.size());
        result_buf += value.size();
      }
    }
  }

  return result;
}